

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

QList<unsigned_int> * __thiscall QRawFont::glyphIndexesForString(QRawFont *this,QString *text)

{
  bool bVar1;
  undefined4 uVar2;
  QRawFontPrivate *pQVar3;
  qsizetype qVar4;
  QChar *size;
  QString *in_RDX;
  QList<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  QList<unsigned_int> *glyphIndexes;
  int numGlyphs;
  QGlyphLayout glyphs;
  ShaperFlag in_stack_ffffffffffffff6c;
  QList<unsigned_int> *in_stack_ffffffffffffff70;
  QFontEngine *this_00;
  qsizetype in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 local_40;
  int local_3c;
  QGlyphLayout local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<unsigned_int>::QList((QList<unsigned_int> *)0x79143c);
  pQVar3 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x791446);
  bVar1 = QRawFontPrivate::isValid(pQVar3);
  if ((bVar1) && (bVar1 = QString::isEmpty((QString *)0x79145e), !bVar1)) {
    qVar4 = QString::size(in_RDX);
    local_3c = (int)qVar4;
    QList<unsigned_int>::resize
              ((QList<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    memset(&local_38,0xaa,0x30);
    QGlyphLayout::QGlyphLayout(&local_38);
    local_38.numGlyphs = local_3c;
    local_38.glyphs = QList<unsigned_int>::data(in_stack_ffffffffffffff70);
    pQVar3 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x7914d5);
    this_00 = pQVar3->fontEngine;
    size = QString::data((QString *)this_00);
    qVar4 = QString::size(in_RDX);
    uVar2 = (undefined4)qVar4;
    QFlags<QFontEngine::ShaperFlag>::QFlags
              ((QFlags<QFontEngine::ShaperFlag> *)this_00,in_stack_ffffffffffffff6c);
    (**(code **)&((DataPointer *)&this_00->_vptr_QFontEngine)->d[6].super_QArrayData)
              (this_00,size,uVar2,&local_38,&local_3c,local_40);
    QList<unsigned_int>::resize
              ((QList<unsigned_int> *)CONCAT44(uVar2,in_stack_ffffffffffffff80),(qsizetype)size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<quint32> QRawFont::glyphIndexesForString(const QString &text) const
{
    QList<quint32> glyphIndexes;
    if (!d->isValid() || text.isEmpty())
        return glyphIndexes;

    int numGlyphs = text.size();
    glyphIndexes.resize(numGlyphs);

    QGlyphLayout glyphs;
    glyphs.numGlyphs = numGlyphs;
    glyphs.glyphs = glyphIndexes.data();
    if (d->fontEngine->stringToCMap(text.data(), text.size(), &glyphs, &numGlyphs, QFontEngine::GlyphIndicesOnly) < 0)
        Q_UNREACHABLE();

    glyphIndexes.resize(numGlyphs);
    return glyphIndexes;
}